

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validation_block_tests.cpp
# Opt level: O3

void __thiscall
validation_block_tests::witness_commitment_index::test_method(witness_commitment_index *this)

{
  unique_ptr<ChainstateManager,_std::default_delete<ChainstateManager>_> *val;
  CScript *this_00;
  undefined8 uVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_01;
  element_type *peVar2;
  pointer pCVar3;
  uint uVar4;
  CAmount CVar5;
  Chainstate *chainstate;
  undefined8 uVar6;
  long lVar7;
  ulong uVar8;
  size_type *psVar9;
  prevector<28U,_unsigned_char,_unsigned_int,_int> *ppVar10;
  _Head_base<0UL,_node::CBlockTemplate_*,_false> _Var11;
  CBlock *pCVar12;
  ulong uVar13;
  char *pcVar14;
  iterator in_R9;
  long in_FS_OFFSET;
  byte bVar15;
  const_string file;
  const_string msg;
  undefined4 local_2e0;
  int local_2dc;
  lazy_ostream local_2d8;
  undefined1 *local_2c8;
  char *local_2c0;
  undefined1 *local_2b8;
  undefined1 *local_2b0;
  char *local_2a8;
  char *local_2a0;
  CMutableTransaction txCoinbase;
  undefined1 local_260 [112];
  assertion_result local_1f0;
  Options options;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock22;
  direct_or_indirect local_190;
  uint local_174;
  CAmount local_170;
  direct_or_indirect local_168;
  uint local_14c;
  CTxOut local_148;
  CBlock pblock;
  undefined1 local_58 [28];
  uint uStack_3c;
  long local_38;
  
  bVar15 = 0;
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  val = &(this->super_BOOST_AUTO_TEST_CASE_FIXTURE).super_RegTestingSetup.super_TestingSetup.
         super_ChainTestingSetup.super_BasicTestingSetup.m_node.chainman;
  pcVar14 = "m_node.chainman";
  inline_assertion_check<true,std::unique_ptr<ChainstateManager,std::default_delete<ChainstateManager>>&>
            (val,
             "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/validation_block_tests.cpp"
             ,0x14a,"test_method","m_node.chainman");
  criticalblock22.super_unique_lock._M_device = &cs_main.super_recursive_mutex;
  criticalblock22.super_unique_lock._M_owns = false;
  std::unique_lock<std::recursive_mutex>::lock(&criticalblock22.super_unique_lock);
  local_58._16_8_ = 0;
  stack0xffffffffffffffc0 = 0;
  local_58._0_8_ = (prevector<28U,_unsigned_char,_unsigned_int,_int> *)0x0;
  local_58._8_8_ = 0;
  pblock.super_CBlockHeader.nVersion._0_1_ = 0x51;
  prevector<28u,unsigned_char,unsigned_int,int>::emplace_back<unsigned_char_const&>
            ((prevector<28u,unsigned_char,unsigned_int,int> *)local_58,(uchar *)&pblock);
  ppVar10 = (prevector<28U,_unsigned_char,_unsigned_int,_int> *)local_58._0_8_;
  uVar4 = uStack_3c - 0x1d;
  if (uStack_3c < 0x1d) {
    ppVar10 = (prevector<28U,_unsigned_char,_unsigned_int,_int> *)local_58;
    uVar4 = uStack_3c;
  }
  pblock.super_CBlockHeader.nVersion._0_1_ = 0x51;
  prevector<28U,_unsigned_char,_unsigned_int,_int>::insert
            ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)local_58,
             (uchar *)((long)&ppVar10->_union + (long)(int)uVar4),(uchar *)&pblock);
  options.super_BlockCreateOptions.use_mempool = true;
  options.super_BlockCreateOptions.coinbase_max_additional_weight = 4000;
  options.super_BlockCreateOptions.coinbase_output_max_additional_sigops = 400;
  options.nBlockMaxWeight = 0x3cf960;
  options.blockMinFeeRate.nSatoshisPerK = 1000;
  options.test_block_validity = true;
  options.print_modified_fee = false;
  chainstate = ChainstateManager::ActiveChainstate
                         ((val->_M_t).
                          super___uniq_ptr_impl<ChainstateManager,_std::default_delete<ChainstateManager>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_ChainstateManager_*,_std::default_delete<ChainstateManager>_>
                          .super__Head_base<0UL,_ChainstateManager_*,_false>._M_head_impl);
  ::node::BlockAssembler::BlockAssembler
            ((BlockAssembler *)&pblock,chainstate,
             (this->super_BOOST_AUTO_TEST_CASE_FIXTURE).super_RegTestingSetup.super_TestingSetup.
             super_ChainTestingSetup.super_BasicTestingSetup.m_node.mempool._M_t.
             super___uniq_ptr_impl<CTxMemPool,_std::default_delete<CTxMemPool>_>._M_t.
             super__Tuple_impl<0UL,_CTxMemPool_*,_std::default_delete<CTxMemPool>_>.
             super__Head_base<0UL,_CTxMemPool_*,_false>._M_head_impl,&options);
  ::node::BlockAssembler::CreateNewBlock((BlockAssembler *)local_260,(CScript *)&pblock);
  std::
  _Hashtable<transaction_identifier<false>,_transaction_identifier<false>,_std::allocator<transaction_identifier<false>_>,_std::__detail::_Identity,_std::equal_to<transaction_identifier<false>_>,_SaltedTxidHasher,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  ::~_Hashtable((_Hashtable<transaction_identifier<false>,_transaction_identifier<false>,_std::allocator<transaction_identifier<false>_>,_std::__detail::_Identity,_std::equal_to<transaction_identifier<false>_>,_SaltedTxidHasher,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                 *)(pblock.super_CBlockHeader.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems +
                   4));
  if ((CBlockTemplate *)
      CONCAT71(pblock.super_CBlockHeader._1_7_,(undefined1)pblock.super_CBlockHeader.nVersion) !=
      (CBlockTemplate *)0x0) {
    std::default_delete<node::CBlockTemplate>::operator()
              ((default_delete<node::CBlockTemplate> *)&pblock,
               (CBlockTemplate *)
               CONCAT71(pblock.super_CBlockHeader._1_7_,
                        (undefined1)pblock.super_CBlockHeader.nVersion));
  }
  uVar6 = local_260._0_8_;
  _Var11._M_head_impl = (CBlockTemplate *)local_260._0_8_;
  pCVar12 = &pblock;
  for (lVar7 = 10; lVar7 != 0; lVar7 = lVar7 + -1) {
    uVar1 = *(undefined8 *)_Var11._M_head_impl;
    (pCVar12->super_CBlockHeader).nVersion = (int)uVar1;
    (pCVar12->super_CBlockHeader).hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0] =
         (char)((ulong)uVar1 >> 0x20);
    (pCVar12->super_CBlockHeader).hashPrevBlock.super_base_blob<256U>.m_data._M_elems[1] =
         (char)((ulong)uVar1 >> 0x28);
    (pCVar12->super_CBlockHeader).hashPrevBlock.super_base_blob<256U>.m_data._M_elems[2] =
         (char)((ulong)uVar1 >> 0x30);
    (pCVar12->super_CBlockHeader).hashPrevBlock.super_base_blob<256U>.m_data._M_elems[3] =
         (char)((ulong)uVar1 >> 0x38);
    _Var11._M_head_impl =
         (CBlockTemplate *)((uchar *)((long)_Var11._M_head_impl + 8) + (ulong)bVar15 * -0x10);
    pCVar12 = (CBlock *)((long)pCVar12 + (ulong)bVar15 * -0x10 + 8);
  }
  std::
  vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ::vector(&pblock.vtx,&((CBlock *)local_260._0_8_)->vtx);
  pblock.m_checked_merkle_root = ((CBlock *)uVar6)->m_checked_merkle_root;
  pCVar12 = (CBlock *)uVar6;
  pblock.fChecked = pCVar12->fChecked;
  pblock.m_checked_witness_commitment = pCVar12->m_checked_witness_commitment;
  CTxOut::CTxOut(&local_148);
  this_00 = &local_148.scriptPubKey;
  prevector<28U,_unsigned_char,_unsigned_int,_int>::resize(&this_00->super_CScriptBase,0x26);
  uVar6 = this_00;
  if (0x1c < local_148.scriptPubKey.super_CScriptBase._size) {
    uVar6 = local_148.scriptPubKey.super_CScriptBase._union.indirect_contents.indirect;
  }
  (((CScript *)uVar6)->super_CScriptBase)._union.direct[0] = 'j';
  uVar6 = local_148.scriptPubKey.super_CScriptBase._union.indirect_contents.indirect;
  if (local_148.scriptPubKey.super_CScriptBase._size < 0x1d) {
    uVar6 = &local_148.scriptPubKey.super_CScriptBase._union;
  }
  *(char *)(uVar6 + 1) = '$';
  uVar6 = local_148.scriptPubKey.super_CScriptBase._union.indirect_contents.indirect;
  if (local_148.scriptPubKey.super_CScriptBase._size < 0x1d) {
    uVar6 = &local_148.scriptPubKey.super_CScriptBase._union;
  }
  *(char *)(uVar6 + 2) = -0x56;
  uVar6 = local_148.scriptPubKey.super_CScriptBase._union.indirect_contents.indirect;
  if (local_148.scriptPubKey.super_CScriptBase._size < 0x1d) {
    uVar6 = &local_148.scriptPubKey.super_CScriptBase._union;
  }
  *(char *)(uVar6 + 3) = '!';
  uVar6 = local_148.scriptPubKey.super_CScriptBase._union.indirect_contents.indirect;
  if (local_148.scriptPubKey.super_CScriptBase._size < 0x1d) {
    uVar6 = &local_148.scriptPubKey.super_CScriptBase._union;
  }
  *(char *)(uVar6 + 4) = -0x57;
  uVar6 = local_148.scriptPubKey.super_CScriptBase._union.indirect_contents.indirect;
  if (local_148.scriptPubKey.super_CScriptBase._size < 0x1d) {
    uVar6 = &local_148.scriptPubKey.super_CScriptBase._union;
  }
  *(char *)(uVar6 + 5) = -0x13;
  local_170 = local_148.nValue;
  prevector<28U,_unsigned_char,_unsigned_int,_int>::prevector
            ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)&local_168.indirect_contents,
             &this_00->super_CScriptBase);
  prevector<28U,_unsigned_char,_unsigned_int,_int>::resize
            ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)&local_168.indirect_contents,0x27);
  CVar5 = local_148.nValue;
  prevector<28U,_unsigned_char,_unsigned_int,_int>::prevector
            ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)&local_190.indirect_contents,
             &this_00->super_CScriptBase);
  uVar6 = &local_190;
  if (0x1c < local_174) {
    uVar6 = local_190.indirect_contents.indirect;
  }
  ((direct_or_indirect *)&((anon_struct_12_2_7229fdc5_for_indirect_contents *)uVar6)->indirect)->
  direct[0] = 'i';
  CMutableTransaction::CMutableTransaction
            (&txCoinbase,
             ((pblock.vtx.
               super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
               ._M_impl.super__Vector_impl_data._M_start)->
             super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>)._M_ptr);
  std::vector<CTxOut,_std::allocator<CTxOut>_>::resize(&txCoinbase.vout,4);
  (txCoinbase.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
   super__Vector_impl_data._M_start)->nValue = local_148.nValue;
  prevector<28U,_unsigned_char,_unsigned_int,_int>::operator=
            (&((txCoinbase.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
                super__Vector_impl_data._M_start)->scriptPubKey).super_CScriptBase,
             &this_00->super_CScriptBase);
  txCoinbase.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
  super__Vector_impl_data._M_start[1].nValue = local_148.nValue;
  prevector<28U,_unsigned_char,_unsigned_int,_int>::operator=
            (&txCoinbase.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
              super__Vector_impl_data._M_start[1].scriptPubKey.super_CScriptBase,
             &this_00->super_CScriptBase);
  txCoinbase.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
  super__Vector_impl_data._M_start[2].nValue = local_170;
  prevector<28U,_unsigned_char,_unsigned_int,_int>::operator=
            (&txCoinbase.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
              super__Vector_impl_data._M_start[2].scriptPubKey.super_CScriptBase,
             (prevector<28U,_unsigned_char,_unsigned_int,_int> *)&local_168.indirect_contents);
  txCoinbase.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
  super__Vector_impl_data._M_start[3].nValue = CVar5;
  prevector<28U,_unsigned_char,_unsigned_int,_int>::operator=
            (&txCoinbase.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
              super__Vector_impl_data._M_start[3].scriptPubKey.super_CScriptBase,
             (prevector<28U,_unsigned_char,_unsigned_int,_int> *)&local_190.indirect_contents);
  local_260._56_8_ = (element_type *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<CTransaction_const,std::allocator<CTransaction>,CMutableTransaction>
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_260 + 0x40),
             (CTransaction **)(local_260 + 0x38),(allocator<CTransaction> *)(local_260 + 0x10),
             &txCoinbase);
  uVar1 = local_260._64_8_;
  uVar6 = local_260._56_8_;
  local_260._56_8_ = (__buckets_ptr)0x0;
  local_260._64_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  this_01 = ((pblock.vtx.
              super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
              ._M_impl.super__Vector_impl_data._M_start)->
            super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi;
  ((pblock.vtx.
    super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
    ._M_impl.super__Vector_impl_data._M_start)->
  super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>)._M_ptr = (element_type *)uVar6
  ;
  ((pblock.vtx.
    super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
    ._M_impl.super__Vector_impl_data._M_start)->
  super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar1;
  if (this_01 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_01);
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_260._64_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_260._64_8_);
  }
  local_2a8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/validation_block_tests.cpp"
  ;
  local_2a0 = "";
  local_2b8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_2b0 = &boost::unit_test::basic_cstring<char_const>::null;
  file.m_end = (iterator)0x169;
  file.m_begin = (iterator)&local_2a8;
  msg.m_end = in_R9;
  msg.m_begin = pcVar14;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file,(size_t)&local_2b8,msg);
  local_2d8.m_empty = false;
  local_2d8._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013ae088;
  local_2c8 = boost::unit_test::lazy_ostream::inst;
  local_2c0 = "";
  uVar8 = 0xffffffff;
  local_2dc = -1;
  if (pblock.vtx.
      super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      pblock.vtx.
      super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    peVar2 = ((pblock.vtx.
               super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
               ._M_impl.super__Vector_impl_data._M_start)->
             super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
    pCVar3 = (peVar2->vout).super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
             super__Vector_impl_data._M_start;
    lVar7 = (long)(peVar2->vout).super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
                  super__Vector_impl_data._M_finish - (long)pCVar3;
    if (lVar7 != 0) {
      lVar7 = (lVar7 >> 3) * -0x3333333333333333;
      psVar9 = (size_type *)((long)&pCVar3->scriptPubKey + 0x1c);
      uVar13 = 0;
      do {
        if ((((0x42 < *psVar9) &&
             (pcVar14 = *(char **)&((CScriptBase *)(psVar9 + -7))->_union, *pcVar14 == 'j')) &&
            (pcVar14[1] == '$')) &&
           (((pcVar14[2] == -0x56 && (pcVar14[3] == '!')) &&
            ((pcVar14[4] == -0x57 && (pcVar14[5] == -0x13)))))) {
          uVar8 = uVar13 & 0xffffffff;
        }
        local_2dc = (int)uVar8;
        uVar13 = uVar13 + 1;
        psVar9 = psVar9 + 10;
      } while (lVar7 + (ulong)(lVar7 == 0) != uVar13);
    }
  }
  local_260._48_8_ = &local_2dc;
  local_260._8_8_ = &local_2e0;
  local_1f0.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(local_2dc == 2);
  local_2e0 = 2;
  local_1f0.m_message.px = (element_type *)0x0;
  local_1f0.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_260._96_8_ =
       "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/validation_block_tests.cpp"
  ;
  local_260._104_8_ = "";
  local_260._80_8_ = local_260 + 0x30;
  local_260._64_8_ = local_260._64_8_ & 0xffffffffffffff00;
  local_260._56_8_ = &PTR__lazy_ostream_013ae248;
  local_260._72_8_ = boost::unit_test::lazy_ostream::inst;
  local_260._40_8_ = local_260 + 8;
  local_260[0x18] = 0;
  local_260._16_8_ = &PTR__lazy_ostream_013ae248;
  local_260._32_8_ = boost::unit_test::lazy_ostream::inst;
  boost::test_tools::tt_detail::report_assertion
            (&local_1f0,&local_2d8,1,2,REQUIRE,0xf7cc5c,(size_t)(local_260 + 0x60),0x169,
             local_260 + 0x38,"2",(allocator<CTransaction> *)(local_260 + 0x10));
  boost::detail::shared_count::~shared_count(&local_1f0.m_message.pn);
  std::vector<CTxOut,_std::allocator<CTxOut>_>::~vector(&txCoinbase.vout);
  std::vector<CTxIn,_std::allocator<CTxIn>_>::~vector(&txCoinbase.vin);
  if (0x1c < local_174) {
    free(local_190.indirect_contents.indirect);
  }
  if (0x1c < local_14c) {
    free(local_168.indirect_contents.indirect);
  }
  if (0x1c < local_148.scriptPubKey.super_CScriptBase._size) {
    free(local_148.scriptPubKey.super_CScriptBase._union.indirect_contents.indirect);
  }
  std::
  vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ::~vector(&pblock.vtx);
  if ((CBlockTemplate *)local_260._0_8_ != (CBlockTemplate *)0x0) {
    std::default_delete<node::CBlockTemplate>::operator()
              ((default_delete<node::CBlockTemplate> *)local_260,(CBlockTemplate *)local_260._0_8_);
  }
  if (0x1c < uStack_3c) {
    free((void *)local_58._0_8_);
  }
  std::unique_lock<std::recursive_mutex>::~unique_lock(&criticalblock22.super_unique_lock);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

BOOST_AUTO_TEST_CASE(witness_commitment_index)
{
    LOCK(Assert(m_node.chainman)->GetMutex());
    CScript pubKey;
    pubKey << 1 << OP_TRUE;
    BlockAssembler::Options options;
    auto ptemplate = BlockAssembler{m_node.chainman->ActiveChainstate(), m_node.mempool.get(), options}.CreateNewBlock(pubKey);
    CBlock pblock = ptemplate->block;

    CTxOut witness;
    witness.scriptPubKey.resize(MINIMUM_WITNESS_COMMITMENT);
    witness.scriptPubKey[0] = OP_RETURN;
    witness.scriptPubKey[1] = 0x24;
    witness.scriptPubKey[2] = 0xaa;
    witness.scriptPubKey[3] = 0x21;
    witness.scriptPubKey[4] = 0xa9;
    witness.scriptPubKey[5] = 0xed;

    // A witness larger than the minimum size is still valid
    CTxOut min_plus_one = witness;
    min_plus_one.scriptPubKey.resize(MINIMUM_WITNESS_COMMITMENT + 1);

    CTxOut invalid = witness;
    invalid.scriptPubKey[0] = OP_VERIFY;

    CMutableTransaction txCoinbase(*pblock.vtx[0]);
    txCoinbase.vout.resize(4);
    txCoinbase.vout[0] = witness;
    txCoinbase.vout[1] = witness;
    txCoinbase.vout[2] = min_plus_one;
    txCoinbase.vout[3] = invalid;
    pblock.vtx[0] = MakeTransactionRef(std::move(txCoinbase));

    BOOST_CHECK_EQUAL(GetWitnessCommitmentIndex(pblock), 2);
}